

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::UnwrapKeySym
          (SoftHSM *this,CK_MECHANISM_PTR pMechanism,ByteString *wrapped,Token *token,
          OSObject *unwrapKey,ByteString *keydata)

{
  CK_MECHANISM_TYPE CVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  CryptoFactory *pCVar6;
  undefined4 extraout_var;
  SoftHSM *this_00;
  CK_RV CVar8;
  undefined4 extraout_var_00;
  size_t sVar9;
  uchar *__dest;
  long lVar10;
  SoftHSM *pSVar11;
  undefined4 local_c4;
  size_t local_b0;
  ByteString iv;
  ByteString decryptedFinal;
  ByteString local_58;
  long *plVar7;
  
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x2109) {
    if (CVar1 == 0x136) {
      local_b0 = 8;
    }
    else {
      if (CVar1 != 0x1085) {
        return 0x70;
      }
      local_b0 = 0x10;
    }
    local_c4 = 0;
  }
  else if (CVar1 == 0x2109) {
    local_b0 = 0;
    local_c4 = 1;
  }
  else {
    if (CVar1 != 0x210a) {
      return 0x70;
    }
    local_c4 = 2;
    local_b0 = 0;
  }
  pCVar6 = CryptoFactory::i();
  iVar5 = (**pCVar6->_vptr_CryptoFactory)(pCVar6);
  plVar7 = (long *)CONCAT44(extraout_var,iVar5);
  if (plVar7 == (long *)0x0) {
    return 0x70;
  }
  this_00 = (SoftHSM *)operator_new(0x38);
  pSVar11 = this_00;
  SymmetricKey::SymmetricKey((SymmetricKey *)this_00,0);
  CVar8 = getSymmetricKey(pSVar11,(SymmetricKey *)this_00,token,unwrapKey);
  if (CVar8 != 0) {
    (**(code **)(*plVar7 + 0x50))(plVar7,this_00);
    pCVar6 = CryptoFactory::i();
    (*pCVar6->_vptr_CryptoFactory[1])(pCVar6,plVar7);
    return 5;
  }
  iVar5 = (*((Serialisable *)&this_00->_vptr_SoftHSM)->_vptr_Serialisable[4])(this_00);
  sVar9 = ByteString::size((ByteString *)CONCAT44(extraout_var_00,iVar5));
  (*((Serialisable *)&this_00->_vptr_SoftHSM)->_vptr_Serialisable[6])(this_00,sVar9 * 8);
  ByteString::ByteString(&iv);
  ByteString::ByteString(&decryptedFinal);
  if ((pMechanism->mechanism == 0x136) || (pMechanism->mechanism == 0x1085)) {
    ByteString::resize(&iv,local_b0);
    __dest = ByteString::operator[](&iv,0);
    memcpy(__dest,pMechanism->pParameter,local_b0);
    ByteString::ByteString(&local_58);
    cVar2 = (**(code **)(*plVar7 + 0x28))(plVar7,this_00,1,&iv,0,0,&local_58,0);
    local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_58.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    if (cVar2 == '\0') {
      (**(code **)(*plVar7 + 0x50))(plVar7,this_00);
      pCVar6 = CryptoFactory::i();
      CVar8 = 0x70;
      (*pCVar6->_vptr_CryptoFactory[1])(pCVar6,plVar7);
      goto LAB_00142397;
    }
    cVar2 = (**(code **)(*plVar7 + 0x30))(plVar7,wrapped,keydata);
    lVar10 = *plVar7;
    if (cVar2 != '\0') {
      cVar2 = (**(code **)(lVar10 + 0x38))(plVar7,&decryptedFinal);
      if (cVar2 != '\0') {
        pSVar11 = (SoftHSM *)keydata;
        ByteString::operator+=(keydata,&decryptedFinal);
        bVar3 = RFC5652Unpad(pSVar11,keydata,local_b0);
        if (bVar3) {
          CVar8 = 0;
          goto LAB_00142333;
        }
      }
      lVar10 = *plVar7;
    }
    (**(code **)(lVar10 + 0x50))(plVar7,this_00);
    pCVar6 = CryptoFactory::i();
    CVar8 = 5;
    (*pCVar6->_vptr_CryptoFactory[1])(pCVar6,plVar7);
  }
  else {
    bVar4 = (**(code **)(*plVar7 + 0x48))(plVar7,this_00,local_c4,wrapped,keydata);
    CVar8 = (ulong)(bVar4 ^ 1) * 5;
LAB_00142333:
    (**(code **)(*plVar7 + 0x50))(plVar7,this_00);
    pCVar6 = CryptoFactory::i();
    (*pCVar6->_vptr_CryptoFactory[1])(pCVar6,plVar7);
  }
LAB_00142397:
  decryptedFinal._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&decryptedFinal.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  iv._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&iv.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar8;
}

Assistant:

CK_RV SoftHSM::UnwrapKeySym
(
	CK_MECHANISM_PTR pMechanism,
	ByteString& wrapped,
	Token* token,
	OSObject* unwrapKey,
	ByteString& keydata
)
{
	// Get the symmetric algorithm matching the mechanism
	SymAlgo::Type algo = SymAlgo::Unknown;
	SymWrap::Type mode = SymWrap::Unknown;
	size_t bb = 8;
	size_t blocksize = 0;
	
	switch(pMechanism->mechanism) {
#ifdef HAVE_AES_KEY_WRAP
		case CKM_AES_KEY_WRAP:
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP;
			break;
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
		case CKM_AES_KEY_WRAP_PAD:
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP_PAD;
			break;
#endif
	        case CKM_AES_CBC_PAD:
			algo = SymAlgo::AES;
			blocksize = 16;
			break;
			
	        case CKM_DES3_CBC_PAD:
			algo = SymAlgo::DES3;
			blocksize = 8;
		        break;
		  
		default:
			return CKR_MECHANISM_INVALID;
	}

	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* unwrappingkey = new SymmetricKey();

	if (getSymmetricKey(unwrappingkey, token, unwrapKey) != CKR_OK)
	{
		cipher->recycleKey(unwrappingkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_GENERAL_ERROR;
	}

	// adjust key bit length
	unwrappingkey->setBitLen(unwrappingkey->getKeyBits().size() * bb);

	ByteString iv;
	ByteString decryptedFinal;
	CK_RV rv = CKR_OK;
	
	switch(pMechanism->mechanism) {

	case CKM_AES_CBC_PAD:
	case CKM_DES3_CBC_PAD:
		iv.resize(blocksize);
		memcpy(&iv[0], pMechanism->pParameter, blocksize);
			
		if (!cipher->decryptInit(unwrappingkey, SymMode::CBC, iv, false))
		{
			cipher->recycleKey(unwrappingkey);
			CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
			return CKR_MECHANISM_INVALID;
		}
		if (!cipher->decryptUpdate(wrapped, keydata))
		{
			cipher->recycleKey(unwrappingkey);
			CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
			return CKR_GENERAL_ERROR;
		}
		// Finalize encryption
		if (!cipher->decryptFinal(decryptedFinal))
		{
			cipher->recycleKey(unwrappingkey);
			CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
			return CKR_GENERAL_ERROR;
		}
		keydata += decryptedFinal;

		if(!RFC5652Unpad(keydata,blocksize))
		{
			cipher->recycleKey(unwrappingkey);
			CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
			return CKR_GENERAL_ERROR; // TODO should be another error
		}
		break;
		
	default:
		// Unwrap the key
		rv = CKR_OK;
		if (!cipher->unwrapKey(unwrappingkey, mode, wrapped, keydata))
			rv = CKR_GENERAL_ERROR;
	}

	cipher->recycleKey(unwrappingkey);
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
	return rv;
}